

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.h
# Opt level: O3

void __thiscall
Queue<std::vector<signed_char,_std::allocator<signed_char>_>_>::pushRead
          (Queue<std::vector<signed_char,_std::allocator<signed_char>_>_> *this,
          unique_ptr<std::vector<signed_char,_std::allocator<signed_char>_>,_std::default_delete<std::vector<signed_char,_std::allocator<signed_char>_>_>_>
          *v)

{
  iterator *piVar1;
  _Elt_pointer puVar2;
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_28;
  
  local_28._M_owns = false;
  local_28._M_device = &this->m_;
  std::unique_lock<std::mutex>::lock(&local_28);
  local_28._M_owns = true;
  if (this->closed_ == false) {
    puVar2 = (this->write_).
             super__Deque_base<std::unique_ptr<std::vector<signed_char,_std::allocator<signed_char>_>,_std::default_delete<std::vector<signed_char,_std::allocator<signed_char>_>_>_>,_std::allocator<std::unique_ptr<std::vector<signed_char,_std::allocator<signed_char>_>,_std::default_delete<std::vector<signed_char,_std::allocator<signed_char>_>_>_>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (puVar2 == (this->write_).
                  super__Deque_base<std::unique_ptr<std::vector<signed_char,_std::allocator<signed_char>_>,_std::default_delete<std::vector<signed_char,_std::allocator<signed_char>_>_>_>,_std::allocator<std::unique_ptr<std::vector<signed_char,_std::allocator<signed_char>_>,_std::default_delete<std::vector<signed_char,_std::allocator<signed_char>_>_>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
      std::
      deque<std::unique_ptr<std::vector<signed_char,std::allocator<signed_char>>,std::default_delete<std::vector<signed_char,std::allocator<signed_char>>>>,std::allocator<std::unique_ptr<std::vector<signed_char,std::allocator<signed_char>>,std::default_delete<std::vector<signed_char,std::allocator<signed_char>>>>>>
      ::
      _M_push_back_aux<std::unique_ptr<std::vector<signed_char,std::allocator<signed_char>>,std::default_delete<std::vector<signed_char,std::allocator<signed_char>>>>>
                ((deque<std::unique_ptr<std::vector<signed_char,std::allocator<signed_char>>,std::default_delete<std::vector<signed_char,std::allocator<signed_char>>>>,std::allocator<std::unique_ptr<std::vector<signed_char,std::allocator<signed_char>>,std::default_delete<std::vector<signed_char,std::allocator<signed_char>>>>>>
                  *)&this->write_,v);
    }
    else {
      (puVar2->_M_t).
      super___uniq_ptr_impl<std::vector<signed_char,_std::allocator<signed_char>_>,_std::default_delete<std::vector<signed_char,_std::allocator<signed_char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::vector<signed_char,_std::allocator<signed_char>_>_*,_std::default_delete<std::vector<signed_char,_std::allocator<signed_char>_>_>_>
      .super__Head_base<0UL,_std::vector<signed_char,_std::allocator<signed_char>_>_*,_false>.
      _M_head_impl = (v->_M_t).
                     super___uniq_ptr_impl<std::vector<signed_char,_std::allocator<signed_char>_>,_std::default_delete<std::vector<signed_char,_std::allocator<signed_char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::vector<signed_char,_std::allocator<signed_char>_>_*,_std::default_delete<std::vector<signed_char,_std::allocator<signed_char>_>_>_>
                     .
                     super__Head_base<0UL,_std::vector<signed_char,_std::allocator<signed_char>_>_*,_false>
                     ._M_head_impl;
      (v->_M_t).
      super___uniq_ptr_impl<std::vector<signed_char,_std::allocator<signed_char>_>,_std::default_delete<std::vector<signed_char,_std::allocator<signed_char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::vector<signed_char,_std::allocator<signed_char>_>_*,_std::default_delete<std::vector<signed_char,_std::allocator<signed_char>_>_>_>
      .super__Head_base<0UL,_std::vector<signed_char,_std::allocator<signed_char>_>_*,_false>.
      _M_head_impl = (vector<signed_char,_std::allocator<signed_char>_> *)0x0;
      piVar1 = &(this->write_).
                super__Deque_base<std::unique_ptr<std::vector<signed_char,_std::allocator<signed_char>_>,_std::default_delete<std::vector<signed_char,_std::allocator<signed_char>_>_>_>,_std::allocator<std::unique_ptr<std::vector<signed_char,_std::allocator<signed_char>_>,_std::default_delete<std::vector<signed_char,_std::allocator<signed_char>_>_>_>_>_>
                ._M_impl.super__Deque_impl_data._M_finish;
      piVar1->_M_cur = piVar1->_M_cur + 1;
    }
    std::condition_variable::notify_one();
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_28);
  return;
}

Assistant:

void pushRead(std::unique_ptr<T> v) {
    std::unique_lock<std::mutex> lock(m_);
    if (!closed_) {
      write_.push_back(std::move(v));
      cv_.notify_one();
    }
  }